

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O0

void __thiscall ON_MeshVertexFaceMap::Destroy(ON_MeshVertexFaceMap *this)

{
  ON_MeshVertexFaceMap_BLK *pOVar1;
  ON_MeshVertexFaceMap_BLK *next;
  ON_MeshVertexFaceMap_BLK *blk;
  ON_MeshVertexFaceMap *this_local;
  
  pOVar1 = (ON_MeshVertexFaceMap_BLK *)this->m_p;
  this->m_vertex_count = 0;
  this->m_face_count = 0;
  this->m_vertex_face_map = (uint **)0x0;
  this->m_p = (void *)0x0;
  while (next = pOVar1, next != (ON_MeshVertexFaceMap_BLK *)0x0) {
    pOVar1 = next->m_next;
    if (next != (ON_MeshVertexFaceMap_BLK *)0x0) {
      operator_delete__(next);
    }
  }
  return;
}

Assistant:

void ON_MeshVertexFaceMap::Destroy()
{
  ON_MeshVertexFaceMap_BLK* blk;
  ON_MeshVertexFaceMap_BLK* next;

  blk = (ON_MeshVertexFaceMap_BLK*)m_p;
  
  m_vertex_count = 0;
  m_face_count = 0;
  m_vertex_face_map = 0;
  m_p = 0;

  while ( blk )
  {
    next = blk->m_next;
    delete[] blk;
    blk = next;
  }
}